

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

void __thiscall
icu_63::StringTrieBuilder::build
          (StringTrieBuilder *this,UStringTrieBuildOption buildOption,int32_t elementsLength,
          UErrorCode *errorCode)

{
  UBool UVar1;
  Node *pNVar2;
  Node *root;
  UErrorCode *errorCode_local;
  int32_t elementsLength_local;
  UStringTrieBuildOption buildOption_local;
  StringTrieBuilder *this_local;
  
  if (buildOption == USTRINGTRIE_BUILD_FAST) {
    writeNode(this,0,elementsLength,0);
  }
  else {
    createCompactBuilder(this,elementsLength << 1,errorCode);
    pNVar2 = makeNode(this,0,elementsLength,0,errorCode);
    UVar1 = ::U_SUCCESS(*errorCode);
    if (UVar1 != '\0') {
      (*(pNVar2->super_UObject)._vptr_UObject[4])(pNVar2,0xffffffff);
      (*(pNVar2->super_UObject)._vptr_UObject[5])(pNVar2,this);
    }
    deleteCompactBuilder(this);
  }
  return;
}

Assistant:

void
StringTrieBuilder::build(UStringTrieBuildOption buildOption, int32_t elementsLength,
                       UErrorCode &errorCode) {
    if(buildOption==USTRINGTRIE_BUILD_FAST) {
        writeNode(0, elementsLength, 0);
    } else /* USTRINGTRIE_BUILD_SMALL */ {
        createCompactBuilder(2*elementsLength, errorCode);
        Node *root=makeNode(0, elementsLength, 0, errorCode);
        if(U_SUCCESS(errorCode)) {
            root->markRightEdgesFirst(-1);
            root->write(*this);
        }
        deleteCompactBuilder();
    }
}